

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARF.cpp
# Opt level: O0

Pass * wasm::createDWARFDumpPass(void)

{
  Pass *this;
  
  this = (Pass *)operator_new(0x58);
  memset(this,0,0x58);
  DWARFDump::DWARFDump((DWARFDump *)this);
  return this;
}

Assistant:

Pass* createDWARFDumpPass() { return new DWARFDump(); }